

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

Bac_Man_t * Bac_ManCollapse(Bac_Man_t *p)

{
  Bac_Ntk_t *p_00;
  int iVar1;
  uint uVar2;
  Bac_Man_t *pBVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Bac_Man_t *pBVar8;
  size_t sVar9;
  char *pcVar10;
  Abc_Nam_t *pAVar11;
  Bac_Ntk_t *pBVar12;
  char *pcVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  Bac_Ntk_t *p_01;
  int local_34;
  
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar6->pArray = piVar7;
  pBVar8 = (Bac_Man_t *)calloc(1,0x530);
  pcVar13 = p->pName;
  if (pcVar13 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar13);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar13);
  }
  pBVar8->pName = pcVar10;
  pcVar13 = p->pSpec;
  if (pcVar13 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar13);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar13);
  }
  pBVar8->pSpec = pcVar10;
  pAVar11 = Abc_NamRef(p->pStrs);
  pBVar8->pStrs = pAVar11;
  pAVar11 = Abc_NamStart(1000,0x18);
  pBVar8->pMods = pAVar11;
  pBVar8->iRoot = 1;
  pBVar8->nNtks = 1;
  pBVar12 = (Bac_Ntk_t *)calloc(2,0xd0);
  pBVar8->pNtks = pBVar12;
  p_00 = pBVar12 + 1;
  pBVar12[1].pDesign = pBVar8;
  iVar15 = p->iRoot;
  if (((long)iVar15 < 1) || (p->nNtks < iVar15)) {
    p_01 = (Bac_Ntk_t *)0x0;
  }
  else {
    p_01 = p->pNtks + iVar15;
  }
  iVar15 = p_01->NameId;
  iVar5 = (p_01->vInputs).nSize;
  iVar1 = (p_01->vOutputs).nSize;
  iVar4 = Bac_ManClpObjNum(p);
  if (p_00->pDesign == (Bac_Man_t *)0x0) {
    __assert_fail("pNew->pDesign != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
  }
  if (pBVar12[1].vInputs.nSize != 0) {
    __assert_fail("Bac_NtkPiNum(pNew) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
  }
  if (pBVar12[1].vOutputs.nSize != 0) {
    __assert_fail("Bac_NtkPoNum(pNew) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
  }
  pBVar12[1].NameId = iVar15;
  pBVar12[1].iCopy = -1;
  pBVar12[1].iBoxNtk = -1;
  pBVar12[1].iBoxObj = -1;
  if (pBVar12[1].vInputs.nCap < iVar5) {
    piVar7 = pBVar12[1].vInputs.pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)iVar5 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)iVar5 << 2);
    }
    pBVar12[1].vInputs.pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_003bc595;
    pBVar12[1].vInputs.nCap = iVar5;
  }
  if (pBVar12[1].vOutputs.nCap < iVar1) {
    piVar7 = pBVar12[1].vOutputs.pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)iVar1 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)iVar1 << 2);
    }
    pBVar12[1].vOutputs.pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_003bc595;
    pBVar12[1].vOutputs.nCap = iVar1;
  }
  if (pBVar12[1].vType.nCap < iVar4) {
    pcVar13 = pBVar12[1].vType.pArray;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = (char *)malloc((long)iVar4);
    }
    else {
      pcVar13 = (char *)realloc(pcVar13,(long)iVar4);
    }
    pBVar12[1].vType.pArray = pcVar13;
    pBVar12[1].vType.nCap = iVar4;
  }
  if (pBVar12[1].vFanin.nCap < iVar4) {
    piVar7 = pBVar12[1].vFanin.pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)iVar4 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)iVar4 << 2);
    }
    pBVar12[1].vFanin.pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_003bc595;
    pBVar12[1].vFanin.nCap = iVar4;
  }
  pAVar11 = p_00->pDesign->pMods;
  pcVar13 = Abc_NamStr(p_00->pDesign->pStrs,iVar15);
  iVar5 = Abc_NamStrFindOrAdd(pAVar11,pcVar13,&local_34);
  pBVar3 = p_00->pDesign;
  if (local_34 == 0) {
    iVar15 = (int)((ulong)((long)p_00 - (long)pBVar3->pNtks) >> 4) * -0x3b13b13b;
    if ((iVar15 < 1) || (pBVar3->nNtks < iVar15)) {
      __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
    }
    if (iVar5 != iVar15) {
      __assert_fail("NtkId == Bac_NtkId(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
  }
  else {
    pcVar13 = Abc_NamStr(pBVar3->pStrs,iVar15);
    printf("Network with name %s already exists.\n",pcVar13);
  }
  iVar15 = (p_01->vInfo).nSize;
  if ((iVar15 != 0) && (0 < iVar15)) {
    lVar17 = 0;
    do {
      Vec_IntPush(&pBVar12[1].vInfo,(p_01->vInfo).pArray[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 < (p_01->vInfo).nSize);
  }
  if (0 < (p_01->vInputs).nSize) {
    iVar15 = 0;
    do {
      iVar5 = Bac_ObjAlloc(p_00,BAC_OBJ_PI,-1);
      Vec_IntPush(pVVar6,iVar5);
      iVar15 = iVar15 + 1;
    } while (iVar15 < (p_01->vInputs).nSize);
  }
  Bac_NtkCollapse_rec(p_00,p_01,pVVar6);
  uVar2 = pVVar6->nSize;
  if (uVar2 != (p_01->vOutputs).nSize) {
    __assert_fail("Vec_IntSize(vSigs) == Bac_NtkPoNum(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0x244,"Bac_Man_t *Bac_ManCollapse(Bac_Man_t *)");
  }
  if (0 < (p_01->vOutputs).nSize) {
    uVar18 = 0;
    uVar16 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar16 = uVar18;
    }
    do {
      if (uVar16 == uVar18) goto LAB_003bc538;
      Bac_ObjAlloc(p_00,BAC_OBJ_PO,pVVar6->pArray[uVar18]);
      uVar18 = uVar18 + 1;
    } while ((long)uVar18 < (long)(p_01->vOutputs).nSize);
  }
  if (pBVar12[1].vType.nSize != pBVar12[1].vType.nCap) {
    __assert_fail("Bac_NtkObjNum(pRootNew) == Bac_NtkObjNumAlloc(pRootNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0x247,"Bac_Man_t *Bac_ManCollapse(Bac_Man_t *)");
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  if ((p_01->vName).pArray != (int *)0x0) {
    iVar15 = pBVar12[1].vType.nCap;
    lVar17 = (long)iVar15;
    if (lVar17 == 0) {
      __assert_fail("Bac_NtkObjNumAlloc(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
    }
    pVVar6 = &pBVar12[1].vName;
    if (pBVar12[1].vName.nCap < iVar15) {
      piVar7 = pBVar12[1].vName.pArray;
      if (piVar7 == (int *)0x0) {
        piVar7 = (int *)malloc(lVar17 * 4);
      }
      else {
        piVar7 = (int *)realloc(piVar7,lVar17 * 4);
      }
      pBVar12[1].vName.pArray = piVar7;
      if (piVar7 == (int *)0x0) {
LAB_003bc595:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar6->nCap = iVar15;
    }
    if (0 < iVar15) {
      memset(pBVar12[1].vName.pArray,0,lVar17 << 2);
    }
    pBVar12[1].vName.nSize = iVar15;
    if (0 < (p_01->vInputs).nSize) {
      lVar17 = 0;
      do {
        if (pBVar12[1].vInputs.nSize <= lVar17) goto LAB_003bc538;
        uVar2 = pBVar12[1].vInputs.pArray[lVar17];
        iVar15 = Bac_ObjName(p_01,(p_01->vInputs).pArray[lVar17]);
        iVar5 = Bac_ObjName(p_00,uVar2);
        if (iVar5 != 0) goto LAB_003bc557;
        if (((int)uVar2 < 0) || (pBVar12[1].vType.nSize <= (int)uVar2)) goto LAB_003bc519;
        if ((pBVar12[1].vType.pArray[uVar2] & 0xfcU) == 4) goto LAB_003bc557;
        Vec_IntSetEntry(pVVar6,uVar2,iVar15);
        lVar17 = lVar17 + 1;
      } while (lVar17 < (p_01->vInputs).nSize);
    }
    if (0 < (p_01->vOutputs).nSize) {
      lVar17 = 0;
      do {
        iVar15 = (p_01->vOutputs).pArray[lVar17];
        lVar14 = (long)iVar15;
        if ((lVar14 < 0) || (iVar5 = (p_01->vType).nSize, iVar5 <= iVar15)) {
LAB_003bc519:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        pcVar13 = (p_01->vType).pArray;
        if ((pcVar13[lVar14] & 0xfcU) != 4) {
          __assert_fail("Bac_ObjIsCo(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
        }
        if ((p_01->vFanin).nSize <= iVar15) goto LAB_003bc538;
        iVar15 = (p_01->vFanin).pArray[lVar14];
        lVar14 = (long)iVar15;
        if ((lVar14 < 0) || (iVar5 <= iVar15)) goto LAB_003bc519;
        if ((pcVar13[lVar14] & 0xfeU) != 2) {
          if ((p_01->vCopy).nSize <= iVar15) {
LAB_003bc538:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar2 = (p_01->vCopy).pArray[lVar14];
          iVar15 = Bac_ObjName(p_01,iVar15);
          iVar5 = Bac_ObjName(p_00,uVar2);
          if (iVar5 != 0) {
LAB_003bc557:
            __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
          }
          if (((int)uVar2 < 0) || (pBVar12[1].vType.nSize <= (int)uVar2)) goto LAB_003bc519;
          if ((pBVar12[1].vType.pArray[uVar2] & 0xfcU) == 4) goto LAB_003bc557;
          Vec_IntSetEntry(pVVar6,uVar2,iVar15);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < (p_01->vOutputs).nSize);
    }
  }
  return pBVar8;
}

Assistant:

Bac_Man_t * Bac_ManCollapse( Bac_Man_t * p )
{
    int i, iObj;
    Vec_Int_t * vSigs = Vec_IntAlloc( 1000 );
    Bac_Man_t * pNew = Bac_ManStart( p, 1 );
    Bac_Ntk_t * pRoot = Bac_ManRoot( p );
    Bac_Ntk_t * pRootNew = Bac_ManRoot( pNew );
    Bac_NtkAlloc( pRootNew, Bac_NtkNameId(pRoot), Bac_NtkPiNum(pRoot), Bac_NtkPoNum(pRoot), Bac_ManClpObjNum(p) );
    if ( Vec_IntSize(&pRoot->vInfo) )
        Vec_IntAppend( &pRootNew->vInfo, &pRoot->vInfo );
    Bac_NtkForEachPi( pRoot, iObj, i )
        Vec_IntPush( vSigs, Bac_ObjAlloc(pRootNew, BAC_OBJ_PI, -1) );
    Bac_NtkCollapse_rec( pRootNew, pRoot, vSigs );
    assert( Vec_IntSize(vSigs) == Bac_NtkPoNum(pRoot) );
    Bac_NtkForEachPo( pRoot, iObj, i )
        Bac_ObjAlloc( pRootNew, BAC_OBJ_PO, Vec_IntEntry(vSigs, i) );
    assert( Bac_NtkObjNum(pRootNew) == Bac_NtkObjNumAlloc(pRootNew) );
    Vec_IntFree( vSigs );
    // transfer PI/PO names
    if ( Bac_NtkHasNames(pRoot) )
    {
        Bac_NtkStartNames( pRootNew );
        Bac_NtkForEachPi( pRoot, iObj, i )
            Bac_ObjSetName( pRootNew, Bac_NtkPi(pRootNew, i), Bac_ObjName(pRoot, iObj) );
        Bac_NtkForEachPoDriver( pRoot, iObj, i )
            if ( !Bac_ObjIsPi(pRoot, iObj) )
                Bac_ObjSetName( pRootNew, Bac_ObjCopy(pRoot, iObj), Bac_ObjName(pRoot, iObj) );
    }
    return pNew;
}